

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::peer_list::apply_ip_filter
          (peer_list *this,ip_filter *filter,torrent_state *state,
          vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *banned)

{
  _Map_pointer this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  reference pptVar4;
  difference_type dVar5;
  undefined4 extraout_var;
  peer_connection_interface *ppVar6;
  int __type;
  iterator local_198;
  _Self local_178;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_158;
  iterator local_138;
  _Self local_118;
  undefined1 local_f1;
  error_code local_f0;
  address local_e0;
  peer_connection_interface *local_c0;
  peer_connection_interface *p;
  size_t count;
  int local_8c;
  int current;
  iterator local_68;
  undefined1 local_48 [8];
  iterator i;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *banned_local;
  torrent_state *state_local;
  ip_filter *filter_local;
  peer_list *this_local;
  
  i._M_node = (_Map_pointer)banned;
  ::std::deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
  begin((iterator *)local_48,
        (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_> *)
        this);
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          ::std::
          deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
          end(&local_68,
              (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               *)this);
          bVar1 = ::std::operator!=((_Self *)local_48,&local_68);
          if (!bVar1) {
            return;
          }
          pptVar4 = ::std::
                    _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                    ::operator*((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                                 *)local_48);
          torrent_peer::address((address *)&stack0xffffffffffffff78,*pptVar4);
          uVar2 = ip_filter::access(filter,&stack0xffffffffffffff78,__type);
          if ((uVar2 & 1) != 0) break;
          ::std::
          _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
          ::operator++((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                        *)local_48);
        }
        pptVar4 = ::std::
                  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                  ::operator*((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                               *)local_48);
        if (*pptVar4 != this->m_locked_peer) break;
        ::std::
        _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
        ::operator++((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                      *)local_48);
      }
      ::std::
      deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
      begin((iterator *)&count,
            (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             *)this);
      dVar5 = ::std::operator-((_Self *)local_48,(_Self *)&count);
      local_8c = (int)dVar5;
      pptVar4 = ::std::
                _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                ::operator*((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                             *)local_48);
      if ((*pptVar4)->connection != (peer_connection_interface *)0x0) break;
LAB_004f8334:
      ::std::
      _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
      ::_Deque_iterator(&local_158,
                        (_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                         *)local_48);
      erase_peer(this,&local_158,state);
      ::std::
      deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
      begin(&local_198,
            (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             *)this);
      ::std::operator+(&local_178,&local_198,(long)local_8c);
      local_48 = (undefined1  [8])local_178._M_cur;
      i._M_cur = local_178._M_first;
      i._M_first = local_178._M_last;
      i._M_last = (_Elt_pointer)local_178._M_node;
    }
    p = (peer_connection_interface *)
        ::std::
        deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
        size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              *)this);
    pptVar4 = ::std::
              _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
              ::operator*((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                           *)local_48);
    this_00 = i._M_node;
    local_c0 = (*pptVar4)->connection;
    iVar3 = (*local_c0->_vptr_peer_connection_interface[2])();
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
              (&local_e0,(basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var,iVar3));
    ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::push_back
              ((vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
               this_00,&local_e0);
    ppVar6 = local_c0;
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (&local_f0,banned_by_ip_filter,(type *)0x0);
    local_f1 = 0;
    (*ppVar6->_vptr_peer_connection_interface[4])(ppVar6,&local_f0,1,0);
    ppVar6 = (peer_connection_interface *)
             ::std::
             deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     *)this);
    if (p <= ppVar6) goto LAB_004f8334;
    ::std::deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
    ::begin(&local_138,
            (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             *)this);
    ::std::operator+(&local_118,&local_138,(long)local_8c);
    local_48 = (undefined1  [8])local_118._M_cur;
    i._M_cur = local_118._M_first;
    i._M_first = local_118._M_last;
    i._M_last = (_Elt_pointer)local_118._M_node;
  } while( true );
}

Assistant:

void peer_list::apply_ip_filter(ip_filter const& filter
		, torrent_state* state, std::vector<address>& banned)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		for (auto i = m_peers.begin(); i != m_peers.end();)
		{
			if ((filter.access((*i)->address()) & ip_filter::blocked) == 0)
			{
				++i;
				continue;
			}
			if (*i == m_locked_peer)
			{
				++i;
				continue;
			}

			int const current = int(i - m_peers.begin());
			TORRENT_ASSERT(current >= 0);
			TORRENT_ASSERT(m_peers.size() > 0);
			TORRENT_ASSERT(i != m_peers.end());

			if ((*i)->connection)
			{
				// disconnecting the peer here may also delete the
				// peer_info_struct. If that is the case, just continue
				size_t count = m_peers.size();
				peer_connection_interface* p = (*i)->connection;

				banned.push_back(p->remote().address());

				p->disconnect(errors::banned_by_ip_filter
					, operation_t::bittorrent);

				// what *i refers to has changed, i.e. cur was deleted
				if (m_peers.size() < count)
				{
					i = m_peers.begin() + current;
					continue;
				}
				TORRENT_ASSERT((*i)->connection == nullptr
					|| (*i)->connection->peer_info_struct() == nullptr);
			}

			erase_peer(i, state);
			i = m_peers.begin() + current;
		}
	}